

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O2

Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_> __thiscall
capnp::_::anon_unknown_0::TestVat::ConnectionImpl::receiveIncomingMessage(ConnectionImpl *this)

{
  int *piVar1;
  Coroutine<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_> *this_00;
  ProducerConsumerQueue<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_> *this_01;
  PromiseAwaiter<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>
  *__return_storage_ptr__;
  long *plVar2;
  SourceLocation location;
  bool bVar3;
  coroutine_handle<void> handle;
  long lVar4;
  long in_RSI;
  Own<capnp::IncomingRpcMessage,_std::nullptr_t> *this_02;
  Exception local_1c0;
  
  handle._M_fr_ptr = operator_new(0x458);
  *(code **)handle._M_fr_ptr = receiveIncomingMessage;
  *(code **)((long)handle._M_fr_ptr + 8) = receiveIncomingMessage;
  this_00 = (Coroutine<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_> *)
            ((long)handle._M_fr_ptr + 0x10);
  *(long *)((long)handle._M_fr_ptr + 0x448) = in_RSI;
  local_1c0.ownFile.content.ptr =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
  ;
  local_1c0.ownFile.content.size_ = 0x44fd0f;
  local_1c0.ownFile.content.disposer = (ArrayDisposer *)0x39000001ab;
  location.function = "receiveIncomingMessage";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
  ;
  location.lineNumber = 0x1ab;
  location.columnNumber = 0x39;
  kj::_::Coroutine<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>::Coroutine
            (this_00,handle,location);
  kj::_::Coroutine<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>::
  get_return_object((Coroutine<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_> *)
                    this);
  if (*(char *)(in_RSI + 0x108) == '\x01') {
    kj::Exception::Exception(&local_1c0,(Exception *)(in_RSI + 0x110));
    kj::throwFatalException(&local_1c0,0);
  }
  if (*(char *)(in_RSI + 0x2e1) == '\x01') {
    this_02 = (Own<capnp::IncomingRpcMessage,_std::nullptr_t> *)((long)handle._M_fr_ptr + 0x410);
    this_02->disposer = (Disposer *)0x0;
    *(undefined8 *)((long)handle._M_fr_ptr + 0x418) = 0;
    kj::_::Coroutine<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>::fulfill
              (this_00,(FixVoid<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> *)this_02);
    kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>::dispose(this_02);
  }
  else {
    this_01 = (ProducerConsumerQueue<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>
               *)((long)handle._M_fr_ptr + 0x440);
    kj::ProducerConsumerQueue<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>::pop
              (this_01);
    __return_storage_ptr__ =
         (PromiseAwaiter<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_> *)
         ((long)handle._M_fr_ptr + 0x248);
    co_await<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,decltype(nullptr)>>>
              (__return_storage_ptr__,
               (Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_> *)this_01);
    *(undefined1 *)((long)handle._M_fr_ptr + 0x450) = 0;
    bVar3 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
    if (bVar3) {
      return (PromiseBase)(PromiseBase)this;
    }
    kj::_::PromiseAwaiter<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>::
    await_resume((PromiseAwaiter<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_> *)
                 ((long)handle._M_fr_ptr + 0x420));
    kj::_::PromiseAwaiter<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>::
    ~PromiseAwaiter(__return_storage_ptr__);
    kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this_01);
    lVar4 = *(long *)((long)handle._M_fr_ptr + 0x428);
    if (lVar4 == 0) {
      plVar2 = *(long **)(*(long *)((long)handle._M_fr_ptr + 0x448) + 0x2d8);
      if (plVar2 == (long *)0x0) {
        lVar4 = 0;
      }
      else {
        (**(code **)(*plVar2 + 0x10))(plVar2,&local_1c0);
        lVar4 = *(long *)((long)handle._M_fr_ptr + 0x428);
      }
    }
    else {
      piVar1 = (int *)(*(long *)(*(long *)((long)handle._M_fr_ptr + 0x448) + 0x20) + 0x24);
      *piVar1 = *piVar1 + 1;
    }
    *(undefined8 *)((long)handle._M_fr_ptr + 0x430) =
         *(undefined8 *)((long)handle._M_fr_ptr + 0x420);
    *(long *)((long)handle._M_fr_ptr + 0x438) = lVar4;
    *(undefined8 *)((long)handle._M_fr_ptr + 0x428) = 0;
    kj::_::Coroutine<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>::fulfill
              (this_00,(FixVoid<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> *)
                       ((long)handle._M_fr_ptr + 0x430));
    kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>::dispose
              ((Own<capnp::IncomingRpcMessage,_std::nullptr_t> *)((long)handle._M_fr_ptr + 0x430));
    kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>::dispose
              ((Own<capnp::IncomingRpcMessage,_std::nullptr_t> *)((long)handle._M_fr_ptr + 0x420));
  }
  *(undefined8 *)handle._M_fr_ptr = 0;
  *(undefined1 *)((long)handle._M_fr_ptr + 0x450) = 1;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<kj::Maybe<kj::Own<IncomingRpcMessage>>> receiveIncomingMessage() override {
      KJ_IF_SOME(e, networkException) {
        kj::throwFatalException(kj::cp(e));
      }

      if (initiatedIdleShutdown) {
        co_return kj::none;
      }

      auto result = co_await messageQueue.pop();

      if (result == kj::none) {
        KJ_IF_SOME(f, fulfillOnEnd) {
          f->fulfill();
        }
      } else {
        ++vat.received;
      }

      co_return result;
    }